

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bad_identifiers_proto2.pb.cc
# Opt level: O0

void proto2_unittest::TestConflictingSymbolNames::SharedDtor(MessageLite *self)

{
  TestConflictingSymbolNames_DO *pTVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  TestConflictingSymbolNames *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (TestConflictingSymbolNames *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar2 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar2 == (Arena *)0x0) {
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 7));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&local_18[7]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 8));
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&local_18[8]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&local_18[0xf]._internal_metadata_);
    google::protobuf::internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 0x10));
    pTVar1 = (TestConflictingSymbolNames_DO *)local_18[0x10]._internal_metadata_.ptr_;
    if (pTVar1 != (TestConflictingSymbolNames_DO *)0x0) {
      TestConflictingSymbolNames_DO::~TestConflictingSymbolNames_DO(pTVar1);
      operator_delete(pTVar1,0x18);
    }
    pTVar1 = (TestConflictingSymbolNames_DO *)local_18[0x11]._vptr_MessageLite;
    if (pTVar1 != (TestConflictingSymbolNames_DO *)0x0) {
      TestConflictingSymbolNames_DO::~TestConflictingSymbolNames_DO(pTVar1);
      operator_delete(pTVar1,0x18);
    }
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/compiler/cpp/test_bad_identifiers_proto2.pb.cc"
             ,0x1604,"this_.GetArena() == nullptr");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void TestConflictingSymbolNames::SharedDtor(MessageLite& self) {
  TestConflictingSymbolNames& this_ = static_cast<TestConflictingSymbolNames&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.length_.Destroy();
  this_._impl_.string_.Destroy();
  this_._impl_.some_cord_.Destroy();
  this_._impl_.some_string_piece_.Destroy();
  this_._impl_.release_length_.Destroy();
  this_._impl_.target_.Destroy();
  delete this_._impl_.do__;
  delete this_._impl_.release_do_;
  this_._impl_.~Impl_();
}